

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_read_write<true>
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,
          span<char,_18446744073709551615UL> buf)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  anon_class_24_2_633b6da0 *unaff_retaddr;
  pair<std::error_code,_unsigned_long> *value;
  LazyPromise<std::pair<std::error_code,_unsigned_long>_> *in_stack_fffffffffffffe10;
  LazyPromise<std::pair<std::error_code,_unsigned_long>_> *this_00;
  void *in_stack_fffffffffffffe18;
  LazyPromiseBase *this_01;
  Try<std::pair<std::error_code,_unsigned_long>_> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  
  puVar2 = (undefined8 *)operator_new(200,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = async_read_write<true>;
    puVar2[1] = async_read_write<true>;
    puVar2[0x17] = in_RSI;
    puVar2[0x10] = in_RDX;
    puVar2[0x11] = in_RCX;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              (in_stack_fffffffffffffe10);
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xc5));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xc5));
      puVar2[0xd] = puVar2[0x17];
      puVar2[0xe] = puVar2[0x10];
      puVar2[0xf] = puVar2[0x11];
      this_01 = (LazyPromiseBase *)puVar2[0xf];
      value = (pair<std::error_code,_unsigned_long> *)puVar2[0xd];
      this_00 = (LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)puVar2[0xe];
      post<coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_read_write<true>(std::span<char,18446744073709551615ul>)::_lambda()_1_>
                (unaff_retaddr,in_RCX);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
                (this_01,(Lazy<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_> *)
                         this_00);
      bVar1 = async_simple::coro::detail::
              LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::
              await_ready((LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>
                           *)(puVar2 + 0x14));
      if (bVar1) {
        puVar2[0x12] = puVar2 + 9;
        puVar2[0x13] = (LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>
                        *)(puVar2 + 0x14);
        async_simple::coro::detail::
        LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::awaitResume
                  ((LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        async_simple::coro::detail::
        LazyBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>,_false>::ValueAwaiter
        ::~ValueAwaiter((ValueAwaiter *)0x2d8960);
        async_simple::coro::Lazy<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::
        ~Lazy((Lazy<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_> *)0x2d896d);
        async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::value
                  (in_stack_fffffffffffffe20);
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_&>(this_00,value);
        async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::~Try
                  ((Try<std::pair<std::error_code,_unsigned_long>_> *)0x2d89b7);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0xc6));
        if (bVar1) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xc6));
          async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
          ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x2d8b69);
          if (puVar2 != (undefined8 *)0x0) {
            operator_delete(puVar2,200);
          }
        }
        else {
          *puVar2 = 0;
          *(undefined1 *)((long)puVar2 + 0xc4) = 2;
          coro_io::basic_seq_coro_file(in_stack_fffffffffffffe20,this_01);
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xc4) = 1;
        coro_io::basic_seq_coro_file
                  ((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xc4) = 0;
      coro_io::basic_seq_coro_file(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read_write(
      std::span<char> buf) {
    auto result = co_await coro_io::post(
        [this, buf]() -> std::pair<std::error_code, size_t> {
          if constexpr (is_read) {
            if (frw_seq_file_.read(buf.data(), buf.size())) {
              return std::make_pair(std::error_code{}, frw_seq_file_.gcount());
            }
          }
          else {
            if (frw_seq_file_.write(buf.data(), buf.size())) {
              return std::make_pair(std::error_code{}, buf.size());
            }
          }

          if (frw_seq_file_.eof()) {
            eof_ = true;
            return std::make_pair(std::error_code{}, frw_seq_file_.gcount());
          }

          return std::make_pair(std::make_error_code(std::errc::io_error), 0);
        },
        &executor_wrapper_);

    co_return result.value();
  }